

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O2

void __thiscall
ylt::metric::basic_dynamic_histogram<double,_(unsigned_char)'\x02'>::serialize
          (basic_dynamic_histogram<double,_(unsigned_char)__x02_> *this,string *str)

{
  string *__str;
  element_type *label_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer psVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  value_type counter;
  vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
  bucket_counts;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
  value_map;
  string value_str;
  double local_d8;
  __shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
  local_b0;
  vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
  local_a0;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
  local_88;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  util::
  map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_hash<137ul>>
  ::
  copy<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::metric_pair>>
            (&local_88,
             (map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<double>,(unsigned_char)2>::my_hash<137ul>>
              *)&(((this->sum_).
                   super___shared_ptr<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>).
                 super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>.map_);
  if (local_88.
      super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    metric_t::serialize_head((metric_t *)this,str);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    std::
    vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>_>_>
    ::vector(&local_a0,&this->bucket_counts_);
    __str = &(this->super_dynamic_metric).super_metric_t.name_;
    for (psVar2 = local_88.
                  super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar2 != local_88.
                  super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
      label_value = (psVar2->
                    super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
      if (ABS((label_value->value).super___atomic_float<double>._M_fp) != 0.0) {
        local_d8 = 0.0;
        lVar3 = 0;
        for (uVar4 = 0;
            uVar4 < (ulong)((long)local_a0.
                                  super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_a0.
                                  super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1
            ) {
          std::
          __shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_b0,
                         (__shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
                          *)((long)&((local_a0.
                                      super__Vector_base<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar3));
          pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_50,__str);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (pbVar1,"_bucket{");
          if ((this->super_dynamic_metric).super_metric_t.labels_name_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (this->super_dynamic_metric).super_metric_t.labels_name_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            metric_t::build_label_string<std::array<std::__cxx11::string,2ul>>
                      ((metric_t *)this,&local_50,
                       &(this->super_dynamic_metric).super_metric_t.labels_name_,&label_value->label
                      );
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_50,",");
          }
          if (uVar4 == (long)(this->bucket_boundaries_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->bucket_boundaries_).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3) {
            pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_50,"le=\"");
            pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(pbVar1,"+Inf");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (pbVar1,"\"} ");
          }
          else {
            pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_50,"le=\"");
            std::__cxx11::to_string
                      (&local_70,
                       (this->bucket_boundaries_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar4]);
            pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(pbVar1,&local_70);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (pbVar1,"\"} ");
            std::__cxx11::string::~string((string *)&local_70);
          }
          dVar5 = basic_dynamic_counter<double,_(unsigned_char)'\x02'>::value
                            (local_b0._M_ptr,&label_value->label);
          local_d8 = local_d8 + dVar5;
          std::__cxx11::to_string(&local_70,local_d8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_50,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_50,"\n");
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
          lVar3 = lVar3 + 0x10;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (str,&local_50);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (str,__str);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (str,"_sum{");
        metric_t::build_label_string<std::array<std::__cxx11::string,2ul>>
                  ((metric_t *)this,str,
                   &(((this->sum_).
                      super___shared_ptr<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>).
                    super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>.
                    super_dynamic_metric.super_metric_t.labels_name_,&label_value->label);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (str,"} ");
        std::__cxx11::to_string(&local_70,(label_value->value).super___atomic_float<double>._M_fp);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (str,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (str,"\n");
        pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(str,__str);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (pbVar1,"_count{");
        metric_t::build_label_string<std::array<std::__cxx11::string,2ul>>
                  ((metric_t *)this,str,
                   &(((this->sum_).
                      super___shared_ptr<ylt::metric::basic_dynamic_gauge<double,_(unsigned_char)__x02_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_basic_dynamic_counter<double,_(unsigned_char)__x02_>).
                    super_dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>.
                    super_dynamic_metric.super_metric_t.labels_name_,&label_value->label);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (str,"} ");
        std::__cxx11::to_string(&local_70,local_d8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (str,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (str,"\n");
      }
    }
    if (local_50._M_string_length == 0) {
      str->_M_string_length = 0;
      *(str->_M_dataplus)._M_p = '\0';
    }
    std::
    vector<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_dynamic_counter<double,_(unsigned_char)'\x02'>_>_>_>
    ::~vector(&local_a0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::metric_pair>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void serialize(std::string &str) override {
    auto value_map = sum_->copy();
    if (value_map.empty()) {
      return;
    }

    serialize_head(str);

    std::string value_str;
    auto bucket_counts = get_bucket_counts();
    for (auto &e : value_map) {
      auto &labels_value = e->label;
      auto &value = e->value;
      if (value == 0) {
        continue;
      }

      value_type count = 0;
      for (size_t i = 0; i < bucket_counts.size(); i++) {
        auto counter = bucket_counts[i];
        value_str.append(name_).append("_bucket{");
        if (!labels_name_.empty()) {
          build_label_string(value_str, labels_name_, labels_value);
          value_str.append(",");
        }

        if (i == bucket_boundaries_.size()) {
          value_str.append("le=\"").append("+Inf").append("\"} ");
        }
        else {
          value_str.append("le=\"")
              .append(std::to_string(bucket_boundaries_[i]))
              .append("\"} ");
        }

        count += counter->value(labels_value);
        value_str.append(std::to_string(count));
        value_str.append("\n");
      }

      str.append(value_str);

      str.append(name_);
      str.append("_sum{");
      build_label_string(str, sum_->labels_name(), labels_value);
      str.append("} ");

      str.append(std::to_string(value));
      str.append("\n");

      str.append(name_).append("_count{");
      build_label_string(str, sum_->labels_name(), labels_value);
      str.append("} ");
      str.append(std::to_string(count));
      str.append("\n");
    }
    if (value_str.empty()) {
      str.clear();
    }
  }